

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyParseRow(TidyDocImpl *doc,Node *row,GetTokenMode mode)

{
  int iVar1;
  Lexer *pLVar2;
  TidyParserMemory *pTVar3;
  Dict *pDVar4;
  TidyParserMemory data;
  TidyParserMemory data_00;
  Bool BVar5;
  TidyTagId TVar6;
  long lVar7;
  Node *node;
  Node **ppNVar8;
  Node *pNVar9;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  int iVar10;
  TidyParserMemory memory;
  Bool local_74;
  TidyDocImpl *local_70;
  long local_48;
  
  pLVar2 = doc->lexer;
  if (row == (Node *)0x0) {
    iVar10 = (doc->stack).top;
    lVar7 = (long)iVar10;
    if (lVar7 < 0) {
      local_70 = (TidyDocImpl *)0x0;
      local_74 = no;
      pNVar9 = (Node *)0x0;
      iVar1 = 0;
    }
    else {
      pTVar3 = (doc->stack).content;
      local_70 = (TidyDocImpl *)pTVar3[lVar7].original_node;
      pNVar9 = pTVar3[lVar7].reentry_node;
      iVar1 = pTVar3[lVar7].reentry_state;
      local_74 = pTVar3[lVar7].register_1;
      (doc->stack).top = iVar10 + -1;
    }
  }
  else {
    local_74 = no;
    pNVar9 = (Node *)0x0;
    iVar1 = 0;
    local_70 = (TidyDocImpl *)row;
    if ((row->tag->model & 1) != 0) {
      return (Node *)0x0;
    }
  }
LAB_0013f0d5:
  do {
    do {
      iVar10 = iVar1;
      if (iVar10 == 0) {
        node = prvTidyGetToken(doc,IgnoreWhitespace);
      }
      else {
        node = pNVar9;
        if (iVar10 == 3) {
          return (Node *)0x0;
        }
      }
      pNVar9 = node;
      if (iVar10 == 2) goto LAB_0013f178;
      if (iVar10 == 1) {
        pLVar2->exiled = no;
        pLVar2->excludeBlocks = local_74;
        goto LAB_0013f1b5;
      }
      iVar1 = iVar10;
    } while (iVar10 != 0);
    pNVar9 = (Node *)0x0;
    iVar1 = 3;
  } while (node == (Node *)0x0);
  if (node->tag == (local_70->root).tag) {
    if (node->type == EndTag) {
      prvTidyFreeNode(doc,node);
      (local_70->root).closed = yes;
    }
    else {
      prvTidyUngetToken(doc);
    }
    FixEmptyRow(doc,&local_70->root);
    return (Node *)0x0;
  }
  if (node->type == EndTag) {
    BVar5 = prvTidynodeHasCM(node,0x82);
    if ((BVar5 != no) || ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_TABLE)))) {
      if (node->tag == (Dict *)0x0) {
        TVar6 = TidyTag_UNKNOWN;
      }
      else {
        TVar6 = node->tag->id;
      }
      for (pNVar9 = (local_70->root).parent; pNVar9 != (Node *)0x0; pNVar9 = pNVar9->parent) {
        if ((pNVar9->tag != (Dict *)0x0) && (pNVar9->tag->id == TVar6)) goto LAB_0013f410;
      }
    }
    if (((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_FORM)) &&
       (BVar5 = prvTidynodeHasCM(node,0x18), BVar5 == no)) {
      pDVar4 = node->tag;
      if ((pDVar4 == (Dict *)0x0) ||
         ((pDVar4->id != TidyTag_TD && ((pDVar4 == (Dict *)0x0 || (pDVar4->id != TidyTag_TH))))))
      goto LAB_0013f245;
    }
    else if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_FORM)) {
      *(byte *)&doc->badForm = (byte)doc->badForm | 1;
    }
  }
  else {
LAB_0013f245:
    BVar5 = InsertMisc(&local_70->root,node);
    pNVar9 = node;
    iVar1 = iVar10;
    if (BVar5 != no) goto LAB_0013f0d5;
    if (node->tag == (Dict *)0x0) {
      if (node->type == TextNode) goto LAB_0013f279;
    }
    else if (node->tag->id != TidyTag_TABLE) {
LAB_0013f279:
      BVar5 = prvTidynodeHasCM(node,0x100);
      if (BVar5 != no) {
LAB_0013f410:
        prvTidyUngetToken(doc);
        return (Node *)0x0;
      }
      if (node->type != EndTag) {
        if ((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_FORM)) {
          BVar5 = prvTidynodeIsText(node);
          pNVar9 = extraout_RDX;
          if ((BVar5 != no) ||
             (BVar5 = prvTidynodeHasCM(node,0x18), pNVar9 = extraout_RDX_00, BVar5 != no)) {
            MoveBeforeTable(local_70,node,pNVar9);
            prvTidyReport(doc,&local_70->root,node,0x27e);
            local_74 = pLVar2->excludeBlocks;
            pLVar2->excludeBlocks = no;
            pLVar2->exiled = yes;
            if (node->type != TextNode) {
              local_48 = (ulong)local_74 << 0x20;
              data.original_node = &local_70->root;
              data.identity = prvTidyParseRow;
              data.reentry_node = node;
              data.reentry_mode = IgnoreWhitespace;
              data.reentry_state = 1;
              data.mode = (undefined4)local_48;
              data.register_1 = local_48._4_4_;
              data._40_8_ = 0;
              prvTidypushMemory(doc,data);
              return node;
            }
            pLVar2->exiled = no;
            pLVar2->excludeBlocks = local_74;
            pNVar9 = node;
            goto LAB_0013f0d5;
          }
          if ((node->tag->model & 4) != 0) {
            prvTidyReport(doc,&local_70->root,node,0x27e);
            MoveToHead(doc,&local_70->root,node);
            pNVar9 = node;
            goto LAB_0013f0d5;
          }
        }
        else {
          prvTidyUngetToken(doc);
          node = prvTidyInferredTag(doc,TidyTag_TD);
          prvTidyReport(doc,&local_70->root,node,0x261);
        }
        if (((node != (Node *)0x0) && (pDVar4 = node->tag, pDVar4 != (Dict *)0x0)) &&
           ((pDVar4->id == TidyTag_TD || ((pDVar4 != (Dict *)0x0 && (pDVar4->id == TidyTag_TH))))))
        {
          node->parent = &local_70->root;
          if (local_70 == (TidyDocImpl *)0x0) {
            node->prev = (Node *)0x0;
LAB_0013f4de:
            if (local_70 == (TidyDocImpl *)0x0) goto LAB_0013f4f3;
            ppNVar8 = &(local_70->root).content;
          }
          else {
            pNVar9 = (local_70->root).last;
            node->prev = pNVar9;
            if (pNVar9 == (Node *)0x0) goto LAB_0013f4de;
            ppNVar8 = &pNVar9->next;
          }
          *ppNVar8 = node;
          if (local_70 != (TidyDocImpl *)0x0) {
            (local_70->root).last = node;
          }
LAB_0013f4f3:
          BVar5 = pLVar2->excludeBlocks;
          pLVar2->excludeBlocks = no;
          local_48 = (ulong)BVar5 << 0x20;
          data_00.original_node = &local_70->root;
          data_00.identity = prvTidyParseRow;
          data_00.reentry_node = node;
          data_00.reentry_mode = IgnoreWhitespace;
          data_00.reentry_state = 2;
          data_00.mode = (undefined4)local_48;
          data_00.register_1 = local_48._4_4_;
          data_00._40_8_ = 0;
          prvTidypushMemory(doc,data_00);
          return node;
        }
        prvTidyReport(doc,&local_70->root,node,0x27e);
        prvTidyFreeNode(doc,node);
        pNVar9 = node;
        goto LAB_0013f0d5;
      }
    }
  }
  prvTidyReport(doc,&local_70->root,node,0x235);
  prvTidyFreeNode(doc,node);
  pNVar9 = node;
  iVar1 = iVar10;
  goto LAB_0013f0d5;
LAB_0013f178:
  pLVar2->excludeBlocks = local_74;
  iVar1 = 0;
  if (pLVar2->istackbase < pLVar2->istacksize) {
    do {
      prvTidyPopInline(doc,(Node *)0x0);
    } while (pLVar2->istackbase < pLVar2->istacksize);
LAB_0013f1b5:
    iVar1 = 0;
  }
  goto LAB_0013f0d5;
}

Assistant:

Node* TY_(ParseRow)( TidyDocImpl* doc, Node *row, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool exclude_state = no;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NOT_ENDTAG,        /* To-do after re-entering after !EndTag checks. */
        STATE_POST_TD_TH,             /* To-do after re-entering after TD/TH checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    if ( row == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        row = memory.original_node;
        state = memory.reentry_state;
        exclude_state = memory.register_1;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(row);

        if (row->tag->model & CM_EMPTY)
            return NULL;
    }

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
        {
            node = TY_(GetToken)( doc, IgnoreWhitespace );
            DEBUG_LOG_GOT_TOKEN(node);
        }
    
        switch (state)
        {
            case STATE_INITIAL:
            {
                if ( node == NULL)
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if (node->tag == row->tag)
                {
                    if (node->type == EndTag)
                    {
                        TY_(FreeNode)( doc, node);
                        row->closed = yes;
                        FixEmptyRow( doc, row);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    /* New row start implies end of current row */
                    TY_(UngetToken)( doc );
                    FixEmptyRow( doc, row);
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /*
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                if ( node->type == EndTag )
                {
                    if ( (TY_(nodeHasCM)(node, CM_HTML|CM_TABLE) || nodeIsTABLE(node))
                         && DescendantOf(row, TagId(node)) )
                    {
                        TY_(UngetToken)( doc );
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    if ( nodeIsFORM(node) || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
                    {
                        if ( nodeIsFORM(node) )
                            BadForm( doc );

                        TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if ( nodeIsTD(node) || nodeIsTH(node) )
                    {
                        TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }
                }

                /* deal with comments etc. */
                if (InsertMisc(row, node))
                    continue;

                /* discard unknown tags */
                if (node->tag == NULL && node->type != TextNode)
                {
                    TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* discard unexpected <table> element */
                if ( nodeIsTABLE(node) )
                {
                    TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* THEAD, TFOOT or TBODY */
                if ( TY_(nodeHasCM)(node, CM_ROWGRP) )
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if (node->type == EndTag)
                {
                    TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /*
                  if text or inline or block move before table
                  if head content move to head
                */

                if (node->type != EndTag)
                {
                    if ( nodeIsFORM(node) )
                    {
                        TY_(UngetToken)( doc );
                        node = TY_(InferredTag)(doc, TidyTag_TD);
                        TY_(Report)(doc, row, node, MISSING_STARTTAG);
                    }
                    else if ( TY_(nodeIsText)(node)
                              || TY_(nodeHasCM)(node, CM_BLOCK | CM_INLINE) )
                    {
                        MoveBeforeTable( doc, row, node );
                        TY_(Report)(doc, row, node, TAG_NOT_ALLOWED_IN);
                        lexer->exiled = yes;
                        exclude_state = lexer->excludeBlocks;
                        lexer->excludeBlocks = no;

                        if (node->type != TextNode)
                        {
                            TidyParserMemory memory = {0};
                            memory.identity = TY_(ParseRow);
                            memory.original_node = row;
                            memory.reentry_node = node;
                            memory.reentry_state = STATE_POST_NOT_ENDTAG;
                            memory.register_1 = exclude_state;
                            TY_(pushMemory)( doc, memory );
                            DEBUG_LOG_EXIT_WITH_NODE(node);
                            return node;
                        }
                        
                        lexer->exiled = no;
                        lexer->excludeBlocks = exclude_state;
                        continue;
                    }
                    else if (node->tag->model & CM_HEAD)
                    {
                        TY_(Report)(doc, row, node, TAG_NOT_ALLOWED_IN);
                        MoveToHead( doc, row, node);
                        continue;
                    }
                }

                if ( !(nodeIsTD(node) || nodeIsTH(node)) )
                {
                    TY_(Report)(doc, row, node, TAG_NOT_ALLOWED_IN);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* node should be <TD> or <TH> */
                TY_(InsertNodeAtEnd)(row, node);
                exclude_state = lexer->excludeBlocks;
                lexer->excludeBlocks = no;
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseRow);
                    memory.original_node = row;
                    memory.reentry_node = node;
                    memory.reentry_state = STATE_POST_TD_TH;
                    memory.register_1 = exclude_state;
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT_WITH_NODE(node);
                    return node;
                }
            } break;
                
                
            case STATE_POST_NOT_ENDTAG:
            {
                lexer->exiled = no;
                lexer->excludeBlocks = exclude_state; /* capture this in stack. */
                state = STATE_INITIAL;
                continue;
            } break;
                
                
            case STATE_POST_TD_TH:
            {
                lexer->excludeBlocks = exclude_state; /* capture this in stack. */

                /* pop inline stack */
                while ( lexer->istacksize > lexer->istackbase )
                    TY_(PopInline)( doc, NULL );
                
                state = STATE_INITIAL;
                continue;
            } break;
                
                
            default:
                break;
                
        } /* switch */
    } /* while */
    DEBUG_LOG_EXIT;
    return NULL;
}